

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

rcode __thiscall olc::Platform_Linux::HandleSystemEvent(Platform_Linux *this)

{
  PixelGameEngine *pPVar1;
  int iVar2;
  byte *pbVar3;
  KeySym sym;
  int32_t local_170;
  int32_t local_16c;
  XEvent xev;
  
  do {
    iVar2 = XPending(this->olc_Display);
    if (iVar2 == 0) {
      return OK;
    }
    XNextEvent(this->olc_Display,&xev);
    switch(xev.type) {
    case 2:
      sym = XLookupKeysym(&xev,0);
      pPVar1 = Platform::ptrPGE;
      pbVar3 = std::
               map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
               ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                             *)mapKeys,&sym);
      pPVar1->pKeyNewState[*pbVar3] = true;
      XLookupString(&xev,0,0,&sym,0);
      pPVar1 = Platform::ptrPGE;
      pbVar3 = std::
               map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
               ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                             *)mapKeys,&sym);
      pPVar1->pKeyNewState[*pbVar3] = true;
      break;
    case 3:
      sym = XLookupKeysym(&xev,0);
      pPVar1 = Platform::ptrPGE;
      pbVar3 = std::
               map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
               ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                             *)mapKeys,&sym);
      pPVar1->pKeyNewState[*pbVar3] = false;
      XLookupString(&xev,0,0,&sym,0);
      pPVar1 = Platform::ptrPGE;
      pbVar3 = std::
               map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
               ::operator[]((map<unsigned_long,_unsigned_char,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
                             *)mapKeys,&sym);
      pPVar1->pKeyNewState[*pbVar3] = false;
      break;
    case 4:
      switch(xev.xkey.keycode) {
      case 1:
        Platform::ptrPGE->pMouseNewState[0] = true;
        break;
      case 2:
        Platform::ptrPGE->pMouseNewState[2] = true;
        break;
      case 3:
        Platform::ptrPGE->pMouseNewState[1] = true;
        break;
      case 4:
        Platform::ptrPGE->nMouseWheelDeltaCache = Platform::ptrPGE->nMouseWheelDeltaCache + 0x78;
        break;
      case 5:
        Platform::ptrPGE->nMouseWheelDeltaCache = Platform::ptrPGE->nMouseWheelDeltaCache + -0x78;
      }
      break;
    case 5:
      if (xev.xkey.keycode == 3) {
        Platform::ptrPGE->pMouseNewState[1] = false;
      }
      else if (xev.xkey.keycode == 2) {
        Platform::ptrPGE->pMouseNewState[2] = false;
      }
      else if (xev.xkey.keycode == 1) {
        Platform::ptrPGE->pMouseNewState[0] = false;
      }
      break;
    case 6:
      PixelGameEngine::olc_UpdateMouse(Platform::ptrPGE,xev.xkey.x,xev.xkey.y);
      break;
    case 7:
    case 8:
    case 0xb:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
      break;
    case 9:
      Platform::ptrPGE->bHasInputFocus = true;
      break;
    case 10:
      Platform::ptrPGE->bHasInputFocus = false;
      break;
    case 0xc:
      XGetWindowAttributes(this->olc_Display,this->olc_Window,&sym);
      PixelGameEngine::olc_UpdateWindowSize(Platform::ptrPGE,local_170,local_16c);
      break;
    case 0x16:
      PixelGameEngine::olc_UpdateWindowSize
                (Platform::ptrPGE,xev.xexpose.count,xev.xgraphicsexpose.major_code);
      break;
    default:
      if (xev.type == 0x21) {
        LOCK();
        PixelGameEngine::bAtomActive = 0;
        UNLOCK();
      }
    }
  } while( true );
}

Assistant:

virtual olc::rcode HandleSystemEvent() override
		{
			using namespace X11;
			// Handle Xlib Message Loop - we do this in the
			// same thread that OpenGL was created so we dont
			// need to worry too much about multithreading with X11
			XEvent xev;
			while (XPending(olc_Display))
			{
				XNextEvent(olc_Display, &xev);
				if (xev.type == Expose)
				{
					XWindowAttributes gwa;
					XGetWindowAttributes(olc_Display, olc_Window, &gwa);
					ptrPGE->olc_UpdateWindowSize(gwa.width, gwa.height);
				}
				else if (xev.type == ConfigureNotify)
				{
					XConfigureEvent xce = xev.xconfigure;
					ptrPGE->olc_UpdateWindowSize(xce.width, xce.height);
				}
				else if (xev.type == KeyPress)
				{
					KeySym sym = XLookupKeysym(&xev.xkey, 0);
					ptrPGE->olc_UpdateKeyState(mapKeys[sym], true);
					XKeyEvent *e = (XKeyEvent *)&xev; // Because DragonEye loves numpads
					XLookupString(e, NULL, 0, &sym, NULL);
					ptrPGE->olc_UpdateKeyState(mapKeys[sym], true);
				}
				else if (xev.type == KeyRelease)
				{
					KeySym sym = XLookupKeysym(&xev.xkey, 0);
					ptrPGE->olc_UpdateKeyState(mapKeys[sym], false);
					XKeyEvent *e = (XKeyEvent *)&xev;
					XLookupString(e, NULL, 0, &sym, NULL);
					ptrPGE->olc_UpdateKeyState(mapKeys[sym], false);
				}
				else if (xev.type == ButtonPress)
				{
					switch (xev.xbutton.button)
					{
					case 1:
						ptrPGE->olc_UpdateMouseState(0, true);
						break;
					case 2:
						ptrPGE->olc_UpdateMouseState(2, true);
						break;
					case 3:
						ptrPGE->olc_UpdateMouseState(1, true);
						break;
					case 4:
						ptrPGE->olc_UpdateMouseWheel(120);
						break;
					case 5:
						ptrPGE->olc_UpdateMouseWheel(-120);
						break;
					default:
						break;
					}
				}
				else if (xev.type == ButtonRelease)
				{
					switch (xev.xbutton.button)
					{
					case 1:
						ptrPGE->olc_UpdateMouseState(0, false);
						break;
					case 2:
						ptrPGE->olc_UpdateMouseState(2, false);
						break;
					case 3:
						ptrPGE->olc_UpdateMouseState(1, false);
						break;
					default:
						break;
					}
				}
				else if (xev.type == MotionNotify)
				{
					ptrPGE->olc_UpdateMouse(xev.xmotion.x, xev.xmotion.y);
				}
				else if (xev.type == FocusIn)
				{
					ptrPGE->olc_UpdateKeyFocus(true);
				}
				else if (xev.type == FocusOut)
				{
					ptrPGE->olc_UpdateKeyFocus(false);
				}
				else if (xev.type == ClientMessage)
				{
					ptrPGE->olc_Terminate();
				}
			}
			return olc::OK;
		}